

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_stat(char *args)

{
  int iVar1;
  size_t sVar2;
  size_t strsize;
  size_t strsize_00;
  size_t strsize_01;
  char *pcVar3;
  char *__format;
  PHYSFS_Stat stat;
  char timestring [65];
  uint local_80 [2];
  PHYSFS_sint64 local_78;
  PHYSFS_sint64 local_70;
  PHYSFS_sint64 local_68;
  uint local_60;
  int local_5c;
  char local_58 [72];
  
  pcVar3 = args;
  if (*args == '\"') {
    pcVar3 = args + 1;
    sVar2 = strlen(pcVar3);
    args[sVar2] = '\0';
  }
  iVar1 = PHYSFS_stat(pcVar3,local_80);
  if (iVar1 == 0) {
    pcVar3 = (char *)PHYSFS_getLastError();
    __format = "failed to stat. Reason [%s].\n";
  }
  else {
    printf("Filename: %s\n",pcVar3);
    printf("Size %d\n",(ulong)local_80[0]);
    if ((ulong)local_60 < 3) {
      pcVar3 = &DAT_00106e48 + *(int *)(&DAT_00106e48 + (ulong)local_60 * 4);
    }
    else {
      pcVar3 = "Type: Unknown";
    }
    puts(pcVar3);
    modTimeToStr(local_70,local_58,strsize);
    printf("Created at: %s",local_58);
    modTimeToStr(local_78,local_58,strsize_00);
    printf("Last modified at: %s",local_58);
    modTimeToStr(local_68,local_58,strsize_01);
    printf("Last accessed at: %s",local_58);
    pcVar3 = "true";
    if (local_5c == 0) {
      pcVar3 = "false";
    }
    __format = "Readonly: %s\n";
  }
  printf(__format,pcVar3);
  return 1;
}

Assistant:

static int cmd_stat(char *args)
{
    PHYSFS_Stat stat;
    char timestring[65];

    if (*args == '\"')
    {
        args++;
        args[strlen(args) - 1] = '\0';
    } /* if */

    if(!PHYSFS_stat(args, &stat))
    {
        printf("failed to stat. Reason [%s].\n", PHYSFS_getLastError());
        return 1;
    } /* if */

    printf("Filename: %s\n", args);
    printf("Size %d\n",(int) stat.filesize);

    if(stat.filetype == PHYSFS_FILETYPE_REGULAR)
        printf("Type: File\n");
    else if(stat.filetype == PHYSFS_FILETYPE_DIRECTORY)
        printf("Type: Directory\n");
    else if(stat.filetype == PHYSFS_FILETYPE_SYMLINK)
        printf("Type: Symlink\n");
    else
        printf("Type: Unknown\n");

    printf("Created at: %s", modTimeToStr(stat.createtime, timestring, 64));
    printf("Last modified at: %s", modTimeToStr(stat.modtime, timestring, 64));
    printf("Last accessed at: %s", modTimeToStr(stat.accesstime, timestring, 64));
    printf("Readonly: %s\n", stat.readonly ? "true" : "false");

    return 1;
}